

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderArrow(ImVec2 p_min,ImGuiDir dir,float scale)

{
  ImGuiWindow *pIVar1;
  ImDrawList *this;
  ImU32 col;
  ImVec2 local_d0;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 c;
  ImVec2 b;
  ImVec2 a;
  ImVec2 local_38;
  ImVec2 center;
  float r;
  float h;
  ImGuiWindow *window;
  ImGuiContext *g;
  float scale_local;
  ImGuiDir dir_local;
  ImVec2 p_min_local;
  
  pIVar1 = GImGui->CurrentWindow;
  center.y = GImGui->FontSize;
  center.x = center.y * 0.4 * scale;
  _scale_local = p_min;
  ImVec2::ImVec2(&a,center.y * 0.5,center.y * 0.5 * scale);
  local_38 = operator+((ImVec2 *)&scale_local,&a);
  ImVec2::ImVec2(&b);
  ImVec2::ImVec2(&c);
  ImVec2::ImVec2(&local_58);
  if (dir == -1) {
LAB_0015efcf:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x1159,"void ImGui::RenderArrow(ImVec2, ImGuiDir, float)");
  }
  if ((uint)dir < 2) {
    if (dir == 0) {
      center.x = -center.x;
    }
    local_38.x = local_38.x + center.x * -0.25;
    ImVec2::ImVec2(&local_98,1.0,0.0);
    local_90 = operator*(&local_98,center.x);
    b = local_90;
    ImVec2::ImVec2(&local_a8,-0.5,0.866);
    local_a0 = operator*(&local_a8,center.x);
    c = local_a0;
    ImVec2::ImVec2(&local_b8,-0.5,-0.866);
    local_b0 = operator*(&local_b8,center.x);
    local_58 = local_b0;
  }
  else if (dir - 2U < 2) {
    if (dir == 2) {
      center.x = -center.x;
    }
    local_38.y = local_38.y + center.x * -0.25;
    ImVec2::ImVec2(&local_68,0.0,1.0);
    local_60 = operator*(&local_68,center.x);
    b = local_60;
    ImVec2::ImVec2(&local_78,-0.866,-0.5);
    local_70 = operator*(&local_78,center.x);
    c = local_70;
    ImVec2::ImVec2(&local_88,0.866,-0.5);
    local_80 = operator*(&local_88,center.x);
    local_58 = local_80;
  }
  else if (dir == 4) goto LAB_0015efcf;
  this = pIVar1->DrawList;
  local_c0 = operator+(&local_38,&b);
  local_c8 = operator+(&local_38,&c);
  local_d0 = operator+(&local_38,&local_58);
  col = GetColorU32(0,1.0);
  ImDrawList::AddTriangleFilled(this,&local_c0,&local_c8,&local_d0,col);
  return;
}

Assistant:

void ImGui::RenderArrow(ImVec2 p_min, ImGuiDir dir, float scale)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const float h = g.FontSize * 1.00f;
    float r = h * 0.40f * scale;
    ImVec2 center = p_min + ImVec2(h * 0.50f, h * 0.50f * scale);

    ImVec2 a, b, c;
    switch (dir)
    {
    case ImGuiDir_Up:
    case ImGuiDir_Down:
        if (dir == ImGuiDir_Up) r = -r;
        center.y -= r * 0.25f;
        a = ImVec2(0,1) * r;
        b = ImVec2(-0.866f,-0.5f) * r;
        c = ImVec2(+0.866f,-0.5f) * r;
        break;
    case ImGuiDir_Left:
    case ImGuiDir_Right:
        if (dir == ImGuiDir_Left) r = -r;
        center.x -= r * 0.25f;
        a = ImVec2(1,0) * r;
        b = ImVec2(-0.500f,+0.866f) * r;
        c = ImVec2(-0.500f,-0.866f) * r;
        break;
    case ImGuiDir_None:
    case ImGuiDir_COUNT:
        IM_ASSERT(0);
        break;
    }

    window->DrawList->AddTriangleFilled(center + a, center + b, center + c, GetColorU32(ImGuiCol_Text));
}